

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O0

double ceil(double __x)

{
  bool bVar1;
  HighsCDouble *in_RDI;
  double dVar2;
  double dVar3;
  double ceil_x;
  HighsCDouble res;
  double in_stack_ffffffffffffffa8;
  double *x;
  HighsCDouble *in_stack_ffffffffffffffb0;
  HighsCDouble *this;
  HighsCDouble local_40;
  double local_30;
  HighsCDouble *local_18;
  undefined1 local_10 [16];
  
  local_18 = in_RDI;
  abs((int)in_RDI);
  bVar1 = HighsCDouble::operator<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    bVar1 = HighsCDouble::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if ((!bVar1) &&
       (bVar1 = HighsCDouble::operator<(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), !bVar1
       )) {
      HighsCDouble::HighsCDouble((HighsCDouble *)local_10,1.0);
      return (double)local_10._0_8_;
    }
    HighsCDouble::HighsCDouble((HighsCDouble *)local_10,0.0);
  }
  else {
    dVar2 = HighsCDouble::operator_cast_to_double(local_18);
    dVar2 = ceil(dVar2);
    x = (double *)local_10;
    this = (HighsCDouble *)(local_10 + 8);
    local_30 = dVar2;
    local_40 = HighsCDouble::operator-(this,(double)x);
    dVar3 = HighsCDouble::operator_cast_to_double(&local_40);
    dVar3 = ceil(dVar3);
    HighsCDouble::two_sum(x,&this->hi,dVar2,dVar3);
  }
  return (double)local_10._0_8_;
}

Assistant:

HighsCDouble ceil(const HighsCDouble& x) {
    // Treat |x| < 1 as special case, as per (for example)
    // https://github.com/shibatch/tlfloat: see #2041
    if (abs(x) < 1) {
      if (x == 0 || x < 0) return HighsCDouble(0.0);
      return HighsCDouble(1.0);
    }
    double ceil_x = std::ceil(double(x));
    HighsCDouble res;

    two_sum(res.hi, res.lo, ceil_x, std::ceil(double(x - ceil_x)));
    return res;
  }